

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

bool can_live_in(CHAR_DATA *ch,int hometown)

{
  bool bVar1;
  int in_ESI;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  if ((in_ESI < 6) && (0 < in_ESI)) {
    if (((((hometown_table[in_ESI].align == -1) ||
          ((hometown_table[in_ESI].align == 1 &&
           (bVar1 = is_evil((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), bVar1)))) ||
         ((hometown_table[in_ESI].align == 2 &&
          (bVar1 = is_good((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), bVar1)))) ||
        ((((hometown_table[in_ESI].align == 4 &&
           (bVar1 = is_good((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), !bVar1)) ||
          ((hometown_table[in_ESI].align == 5 &&
           (bVar1 = is_neutral((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), !bVar1))))
         || ((hometown_table[in_ESI].align == 6 &&
             (bVar1 = is_evil((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), !bVar1))))))
       || ((hometown_table[in_ESI].align == 3 &&
           (bVar1 = is_neutral((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), bVar1)))) {
      local_1 = false;
    }
    else if (((((hometown_table[in_ESI].ethos == -1) ||
               ((hometown_table[in_ESI].ethos == 1 &&
                (bVar1 = is_chaotic((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), bVar1)
                ))) || ((hometown_table[in_ESI].ethos == 2 &&
                        (bVar1 = is_lawful((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)),
                        bVar1)))) ||
             ((((hometown_table[in_ESI].ethos == 4 &&
                (bVar1 = is_lawful((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), !bVar1)
                ) || ((hometown_table[in_ESI].ethos == 5 &&
                      (bVar1 = is_eneutral((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)),
                      !bVar1)))) ||
              ((hometown_table[in_ESI].ethos == 6 &&
               (bVar1 = is_chaotic((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), !bVar1)
               ))))) ||
            ((hometown_table[in_ESI].ethos == 3 &&
             (bVar1 = is_eneutral((CHAR_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), bVar1)))
            ) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool can_live_in(CHAR_DATA *ch, int hometown)
{
	if (hometown > MAX_HOMETOWN || hometown <= 0)
		return false;

	if (hometown_table[hometown].align == ALIGN_NONE
		|| hometown_table[hometown].align == ALIGN_GN && is_evil(ch)
		|| hometown_table[hometown].align == ALIGN_NE && is_good(ch)
		|| hometown_table[hometown].align == ALIGN_G && !is_good(ch)
		|| hometown_table[hometown].align == ALIGN_N && !is_neutral(ch)
		|| hometown_table[hometown].align == ALIGN_E && !is_evil(ch)
		|| hometown_table[hometown].align == ALIGN_GE && is_neutral(ch))
	{
		return false;
	}

	if (hometown_table[hometown].ethos == ETHOS_NONE
		|| hometown_table[hometown].ethos == ETHOS_LN && is_chaotic(ch)
		|| hometown_table[hometown].ethos == ETHOS_NC && is_lawful(ch)
		|| hometown_table[hometown].ethos == ETHOS_L && !is_lawful(ch)
		|| hometown_table[hometown].ethos == ETHOS_N && !is_eneutral(ch)
		|| hometown_table[hometown].ethos == ETHOS_C && !is_chaotic(ch)
		|| hometown_table[hometown].ethos == ETHOS_LC && is_eneutral(ch))
	{
		return false;
	}

	return true;
}